

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QChar __thiscall QVariant::toChar(QVariant *this)

{
  QChar QVar1;
  
  QVar1 = qvariant_cast<QChar>(this);
  return (QChar)QVar1.ucs;
}

Assistant:

QChar QVariant::toChar() const
{
    return qvariant_cast<QChar>(*this);
}